

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmathlib.c
# Opt level: O0

lua_Number I2d(unsigned_long x)

{
  lua_Number res;
  long sx;
  unsigned_long x_local;
  
  return (double)(x >> 0xb) * 1.1102230246251565e-16;
}

Assistant:

static lua_Number I2d (Rand64 x) {
  SRand64 sx = (SRand64)(trim64(x) >> shift64_FIG);
  lua_Number res = (lua_Number)(sx) * scaleFIG;
  if (sx < 0)
    res += l_mathop(1.0);  /* correct the two's complement if negative */
  lua_assert(0 <= res && res < 1);
  return res;
}